

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

void __thiscall cfd::TransactionContext::Verify(TransactionContext *this)

{
  AbstractTxIn *pAVar1;
  bool bVar2;
  TransactionContext *this_00;
  AbstractTxIn *this_01;
  OutPoint outpoint;
  
  pAVar1 = &((this->super_Transaction).vin_.
             super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
             super__Vector_impl_data._M_finish)->super_AbstractTxIn;
  for (this_01 = &((this->super_Transaction).vin_.
                   super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                   super__Vector_impl_data._M_start)->super_AbstractTxIn; this_01 != pAVar1;
      this_01 = this_01 + 1) {
    this_00 = (TransactionContext *)&stack0xffffffffffffffb0;
    core::AbstractTxIn::GetOutPoint((OutPoint *)&stack0xffffffffffffffb0,this_01);
    bVar2 = IsFindOutPoint(this_00,&this->verify_ignore_map_,(OutPoint *)&stack0xffffffffffffffb0);
    if (!bVar2) {
      Verify(this,(OutPoint *)&stack0xffffffffffffffb0);
    }
    core::Txid::~Txid((Txid *)&stack0xffffffffffffffb0);
  }
  return;
}

Assistant:

void TransactionContext::Verify() {
  for (const auto& vin : vin_) {
    OutPoint outpoint = vin.GetOutPoint();
    if (!IsFindOutPoint(verify_ignore_map_, outpoint)) {
      Verify(outpoint);
    }
  }
}